

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qlabel.cpp
# Opt level: O3

void QLabel::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QPixmap open;
  uint *puVar1;
  int *piVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  code *pcVar5;
  long lVar6;
  QArrayData *pQVar7;
  char16_t *pcVar8;
  qsizetype qVar9;
  byte bVar10;
  bool bVar11;
  TextFormat TVar12;
  uint uVar13;
  TextFormat TVar14;
  int iVar15;
  QPixmap *pixmap;
  QLabelPrivate *this;
  long in_FS_OFFSET;
  QPixmap local_50 [16];
  undefined8 local_40;
  QString local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      local_38.d.ptr = (char16_t *)_a[1];
      iVar15 = 0;
      goto LAB_004128ac;
    case 1:
      local_38.d.ptr = (char16_t *)_a[1];
      iVar15 = 1;
LAB_004128ac:
      local_38.d.d = (Data *)0x0;
      QMetaObject::activate(_o,&staticMetaObject,iVar15,(void **)&local_38);
      goto switchD_00412685_caseD_3;
    case 2:
      pixmap = (QPixmap *)_a[1];
switchD_004126e5_caseD_0:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        setText((QLabel *)_o,(QString *)pixmap);
        return;
      }
      break;
    case 3:
      pixmap = (QPixmap *)_a[1];
switchD_004126e5_caseD_2:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        setPixmap((QLabel *)_o,pixmap);
        return;
      }
      break;
    case 4:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        setPicture((QLabel *)_o,(QPicture *)_a[1]);
        return;
      }
      break;
    case 5:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        setMovie((QLabel *)_o,*_a[1]);
        return;
      }
      break;
    case 6:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        setNum((QLabel *)_o,*_a[1]);
        return;
      }
      break;
    case 7:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        setNum((QLabel *)_o,*_a[1]);
        return;
      }
      break;
    case 8:
      this = *(QLabelPrivate **)(_o + 8);
      QLabelPrivate::clearContents(this);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_20) break;
      goto LAB_00412a08;
    default:
      goto switchD_00412685_caseD_3;
    }
    goto LAB_00412be2;
  case ReadProperty:
    if (0xb < (uint)_id) goto switchD_00412685_caseD_3;
    break;
  case WriteProperty:
    if (9 < (uint)_id) goto switchD_00412685_caseD_3;
    pixmap = (QPixmap *)*_a;
    switch(_id) {
    case 0:
      goto switchD_004126e5_caseD_0;
    case 1:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        setTextFormat((QLabel *)_o,*(Int *)pixmap);
        return;
      }
      break;
    case 2:
      goto switchD_004126e5_caseD_2;
    case 3:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        setScaledContents((QLabel *)_o,(bool)*pixmap);
        return;
      }
      break;
    case 4:
      this = *(QLabelPrivate **)(_o + 8);
      if ((this->align & 0x1ff) != *(Int *)pixmap) {
        TVar12 = this->align & 0xfffffe00;
        TVar14 = *(Int *)pixmap & 0x1ff;
        goto LAB_004129d2;
      }
      goto switchD_00412685_caseD_3;
    case 5:
      this = *(QLabelPrivate **)(_o + 8);
      TVar12 = this->align & 0xffffefff;
      TVar14 = (uint)(byte)*pixmap << 0xc;
LAB_004129d2:
      this->align = TVar14 | TVar12;
      goto LAB_004129f4;
    case 6:
      this = *(QLabelPrivate **)(_o + 8);
      if (this->margin != *(Int *)pixmap) {
        this->margin = *(Int *)pixmap;
        goto LAB_004129f4;
      }
      goto switchD_00412685_caseD_3;
    case 7:
      this = *(QLabelPrivate **)(_o + 8);
      this->indent = *(Int *)pixmap;
LAB_004129f4:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
LAB_00412a08:
        QLabelPrivate::updateLabel(this);
        return;
      }
      break;
    case 8:
      open = *pixmap;
      lVar6 = *(long *)(_o + 8);
      *(ushort *)(lVar6 + 0x340) =
           (ushort)*(undefined4 *)(lVar6 + 0x340) & 0xfeff | (ushort)(byte)open << 8;
      if (*(QWidgetTextControl **)(lVar6 + 0x2f8) != (QWidgetTextControl *)0x0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          QWidgetTextControl::setOpenExternalLinks
                    (*(QWidgetTextControl **)(lVar6 + 0x2f8),(bool)open);
          return;
        }
        break;
      }
      goto switchD_00412685_caseD_3;
    case 9:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        setTextInteractionFlags((QLabel *)_o,(TextInteractionFlags)*(Int *)pixmap);
        return;
      }
    }
    goto LAB_00412be2;
  default:
    goto switchD_00412685_caseD_3;
  case IndexOfMethod:
    pcVar5 = *_a[1];
    lVar6 = *(long *)((long)_a[1] + 8);
    if (pcVar5 == linkActivated && lVar6 == 0) {
      *(undefined4 *)*_a = 0;
    }
    else if (pcVar5 == linkHovered && lVar6 == 0) {
      *(undefined4 *)*_a = 1;
    }
    goto switchD_00412685_caseD_3;
  }
  puVar1 = (uint *)*_a;
  switch(_id) {
  case 0:
    lVar6 = *(long *)(_o + 8);
    piVar2 = *(int **)(lVar6 + 0x288);
    uVar3 = *(undefined8 *)(lVar6 + 0x290);
    uVar4 = *(undefined8 *)(lVar6 + 0x298);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    pQVar7 = *(QArrayData **)puVar1;
    *(int **)puVar1 = piVar2;
    *(undefined8 *)(puVar1 + 2) = uVar3;
    *(undefined8 *)(puVar1 + 4) = uVar4;
    if (pQVar7 != (QArrayData *)0x0) {
      LOCK();
      (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar7->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          QArrayData::deallocate(pQVar7,2,0x10);
          return;
        }
        goto LAB_00412be2;
      }
    }
    break;
  case 1:
    uVar13 = *(uint *)(*(long *)(_o + 8) + 0x324);
    goto LAB_00412baa;
  case 2:
    QLabel::pixmap((QLabel *)local_50);
    local_38.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_38.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_38.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QPaintDevice::QPaintDevice((QPaintDevice *)&local_38);
    uVar3 = local_40;
    local_38.d.d = (Data *)QDataStream::operator<<;
    local_40 = 0;
    local_38.d.size = *(qsizetype *)(puVar1 + 4);
    *(undefined8 *)(puVar1 + 4) = uVar3;
    QPixmap::~QPixmap((QPixmap *)&local_38);
    QPixmap::~QPixmap(local_50);
    break;
  case 3:
    bVar10 = *(byte *)(*(long *)(_o + 8) + 0x340) >> 1;
    goto LAB_00412bc3;
  case 4:
    *puVar1 = *(uint *)(*(long *)(_o + 8) + 0x338) & 0x1ff;
    break;
  case 5:
    *(byte *)puVar1 = (byte)(*(uint *)(*(long *)(_o + 8) + 0x338) >> 0xc) & 1;
    break;
  case 6:
    uVar13 = *(uint *)(*(long *)(_o + 8) + 0x334);
    goto LAB_00412baa;
  case 7:
    uVar13 = *(uint *)(*(long *)(_o + 8) + 0x33c);
    goto LAB_00412baa;
  case 8:
    bVar10 = *(byte *)(*(long *)(_o + 8) + 0x341);
LAB_00412bc3:
    bVar11 = (bool)(bVar10 & 1);
LAB_00412bc5:
    *(bool *)puVar1 = bVar11;
    break;
  case 9:
    uVar13 = *(uint *)(*(long *)(_o + 8) + 0x32c);
LAB_00412baa:
    *puVar1 = uVar13;
    break;
  case 10:
    bVar11 = hasSelectedText((QLabel *)_o);
    goto LAB_00412bc5;
  case 0xb:
    selectedText(&local_38,(QLabel *)_o);
    pQVar7 = *(QArrayData **)puVar1;
    *(Data **)puVar1 = local_38.d.d;
    pcVar8 = *(char16_t **)(puVar1 + 2);
    *(char16_t **)(puVar1 + 2) = local_38.d.ptr;
    qVar9 = *(qsizetype *)(puVar1 + 4);
    *(qsizetype *)(puVar1 + 4) = local_38.d.size;
    local_38.d.d = (Data *)pQVar7;
    local_38.d.ptr = pcVar8;
    local_38.d.size = qVar9;
    if (pQVar7 != (QArrayData *)0x0) {
      LOCK();
      (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar7->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar7,2,0x10);
      }
    }
  }
switchD_00412685_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
LAB_00412be2:
  __stack_chk_fail();
}

Assistant:

void QLabel::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QLabel *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->linkActivated((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 1: _t->linkHovered((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 2: _t->setText((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 3: _t->setPixmap((*reinterpret_cast< std::add_pointer_t<QPixmap>>(_a[1]))); break;
        case 4: _t->setPicture((*reinterpret_cast< std::add_pointer_t<QPicture>>(_a[1]))); break;
        case 5: _t->setMovie((*reinterpret_cast< std::add_pointer_t<QMovie*>>(_a[1]))); break;
        case 6: _t->setNum((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 7: _t->setNum((*reinterpret_cast< std::add_pointer_t<double>>(_a[1]))); break;
        case 8: _t->clear(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QLabel::*)(const QString & )>(_a, &QLabel::linkActivated, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QLabel::*)(const QString & )>(_a, &QLabel::linkHovered, 1))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QString*>(_v) = _t->text(); break;
        case 1: *reinterpret_cast<Qt::TextFormat*>(_v) = _t->textFormat(); break;
        case 2: *reinterpret_cast<QPixmap*>(_v) = _t->pixmap(); break;
        case 3: *reinterpret_cast<bool*>(_v) = _t->hasScaledContents(); break;
        case 4: *reinterpret_cast<Qt::Alignment*>(_v) = _t->alignment(); break;
        case 5: *reinterpret_cast<bool*>(_v) = _t->wordWrap(); break;
        case 6: *reinterpret_cast<int*>(_v) = _t->margin(); break;
        case 7: *reinterpret_cast<int*>(_v) = _t->indent(); break;
        case 8: *reinterpret_cast<bool*>(_v) = _t->openExternalLinks(); break;
        case 9: *reinterpret_cast<Qt::TextInteractionFlags*>(_v) = _t->textInteractionFlags(); break;
        case 10: *reinterpret_cast<bool*>(_v) = _t->hasSelectedText(); break;
        case 11: *reinterpret_cast<QString*>(_v) = _t->selectedText(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setText(*reinterpret_cast<QString*>(_v)); break;
        case 1: _t->setTextFormat(*reinterpret_cast<Qt::TextFormat*>(_v)); break;
        case 2: _t->setPixmap(*reinterpret_cast<QPixmap*>(_v)); break;
        case 3: _t->setScaledContents(*reinterpret_cast<bool*>(_v)); break;
        case 4: _t->setAlignment(*reinterpret_cast<Qt::Alignment*>(_v)); break;
        case 5: _t->setWordWrap(*reinterpret_cast<bool*>(_v)); break;
        case 6: _t->setMargin(*reinterpret_cast<int*>(_v)); break;
        case 7: _t->setIndent(*reinterpret_cast<int*>(_v)); break;
        case 8: _t->setOpenExternalLinks(*reinterpret_cast<bool*>(_v)); break;
        case 9: _t->setTextInteractionFlags(*reinterpret_cast<Qt::TextInteractionFlags*>(_v)); break;
        default: break;
        }
    }
}